

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheVk.cpp
# Opt level: O0

void __thiscall
Diligent::ShaderResourceCacheVk::SetDynamicBufferOffset
          (ShaderResourceCacheVk *this,Uint32 DescrSetIndex,Uint32 CacheOffset,
          Uint32 DynamicBufferOffset)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  DescriptorSet *this_00;
  Char *pCVar4;
  BufferViewVkImpl *this_01;
  BufferDesc *pBVar5;
  BufferVkImpl *local_c0;
  undefined1 local_a8 [8];
  string msg_2;
  BufferVkImpl *pBufferVk;
  string msg_1;
  undefined1 local_50 [8];
  string msg;
  Resource *DstRes;
  DescriptorSet *DescrSet;
  Uint32 DynamicBufferOffset_local;
  Uint32 CacheOffset_local;
  Uint32 DescrSetIndex_local;
  ShaderResourceCacheVk *this_local;
  
  this_00 = GetDescriptorSet(this,DescrSetIndex);
  msg.field_2._8_8_ = DescriptorSet::GetResource(this_00,CacheOffset);
  bVar3 = IsDynamicDescriptorType(((Resource *)msg.field_2._8_8_)->Type);
  if (!bVar3) {
    FormatString<char[70]>
              ((string *)local_50,
               (char (*) [70])
               "Dynamic offsets can only be set of dynamic uniform or storage buffers");
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"SetDynamicBufferOffset",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
               ,0x1a8);
    std::__cxx11::string::~string((string *)local_50);
  }
  bVar3 = RefCntAutoPtr<Diligent::IDeviceObject>::operator!
                    ((RefCntAutoPtr<Diligent::IDeviceObject> *)(msg.field_2._8_8_ + 8));
  if (bVar3) {
    FormatString<char[47]>
              ((string *)&pBufferVk,(char (*) [47])"Setting dynamic offset when no object is bound")
    ;
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"SetDynamicBufferOffset",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
               ,0x1aa);
    std::__cxx11::string::~string((string *)&pBufferVk);
  }
  if (*(char *)msg.field_2._8_8_ == '\b') {
    local_c0 = RefCntAutoPtr<Diligent::IDeviceObject>::ConstPtr<Diligent::BufferVkImpl>
                         ((RefCntAutoPtr<Diligent::IDeviceObject> *)(msg.field_2._8_8_ + 8));
  }
  else {
    this_01 = RefCntAutoPtr<Diligent::IDeviceObject>::ConstPtr<Diligent::BufferViewVkImpl>
                        ((RefCntAutoPtr<Diligent::IDeviceObject> *)(msg.field_2._8_8_ + 8));
    local_c0 = BufferViewBase<Diligent::EngineVkImplTraits>::GetBuffer<Diligent::BufferVkImpl_const>
                         (&this_01->super_BufferViewBase<Diligent::EngineVkImplTraits>);
  }
  msg_2.field_2._8_8_ = local_c0;
  lVar1 = *(long *)(msg.field_2._8_8_ + 0x10);
  lVar2 = *(long *)(msg.field_2._8_8_ + 0x18);
  pBVar5 = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
           ::GetDesc((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                      *)local_c0);
  if (pBVar5->Size < lVar1 + lVar2 + (ulong)DynamicBufferOffset) {
    FormatString<char[41]>
              ((string *)local_a8,(char (*) [41])"Specified offset is out of buffer bounds");
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"SetDynamicBufferOffset",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
               ,0x1af);
    std::__cxx11::string::~string((string *)local_a8);
  }
  *(Uint32 *)(msg.field_2._8_8_ + 4) = DynamicBufferOffset;
  return;
}

Assistant:

void ShaderResourceCacheVk::SetDynamicBufferOffset(Uint32 DescrSetIndex,
                                                   Uint32 CacheOffset,
                                                   Uint32 DynamicBufferOffset)
{
    DescriptorSet& DescrSet = GetDescriptorSet(DescrSetIndex);
    Resource&      DstRes   = DescrSet.GetResource(CacheOffset);
    VERIFY(IsDynamicDescriptorType(DstRes.Type), "Dynamic offsets can only be set of dynamic uniform or storage buffers");

    DEV_CHECK_ERR(DstRes.pObject, "Setting dynamic offset when no object is bound");
    const BufferVkImpl* pBufferVk = DstRes.Type == DescriptorType::UniformBufferDynamic ?
        DstRes.pObject.ConstPtr<BufferVkImpl>() :
        DstRes.pObject.ConstPtr<BufferViewVkImpl>()->GetBuffer<const BufferVkImpl>();
    DEV_CHECK_ERR(DstRes.BufferBaseOffset + DstRes.BufferRangeSize + DynamicBufferOffset <= pBufferVk->GetDesc().Size,
                  "Specified offset is out of buffer bounds");

    DstRes.BufferDynamicOffset = DynamicBufferOffset;
}